

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::
vector<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
::vector(vector<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>_>
         *this,size_t count,optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_> *value,
        polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>_>
        *alloc)

{
  size_t sVar1;
  long lVar2;
  bool bVar3;
  
  (this->alloc).memoryResource = alloc->memoryResource;
  this->nStored = 0;
  this->ptr = (optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_> *)0x0;
  this->nAlloc = 0;
  reserve(this,count);
  lVar2 = 0;
  sVar1 = count;
  while (bVar3 = sVar1 != 0, sVar1 = sVar1 - 1, bVar3) {
    optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_>::optional
              ((optional<std::pair<pbrt::LightHandle,_pbrt::LightBVHNode_*>_> *)
               ((long)&this->ptr->optionalValue + lVar2),value);
    lVar2 = lVar2 + 0x18;
  }
  this->nStored = count;
  return;
}

Assistant:

vector(size_t count, const T &value, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(count);
        for (size_t i = 0; i < count; ++i)
            this->alloc.template construct<T>(ptr + i, value);
        nStored = count;
    }